

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctstr_startswith(char *str,char *check)

{
  char *pcVar1;
  char *sp;
  char *check_local;
  char *str_local;
  
  if ((str == (char *)0x0) && (check == (char *)0x0)) {
    str_local._4_4_ = 1;
  }
  else if (((str == (char *)0x0) && (check != (char *)0x0)) ||
          ((str != (char *)0x0 && (check == (char *)0x0)))) {
    str_local._4_4_ = 0;
  }
  else {
    pcVar1 = strstr(str,check);
    str_local._4_4_ = (uint)(pcVar1 == str);
  }
  return str_local._4_4_;
}

Assistant:

static int
fctstr_startswith(char const *str, char const *check)
{
    char const *sp;
    if ( str == NULL && check == NULL )
    {
        return 1;
    }
    else if ( ((str == NULL) && (check != NULL))
              || ((str != NULL) && (check == NULL)) )
    {
        return 0;
    }
    sp = strstr(str, check);
    return sp == str;
}